

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bool peparse::readChar16(bounded_buffer *b,uint32_t offset,char16_t *out)

{
  undefined2 *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint8_t tmpBuf [2];
  char16_t tmp;
  _func_ios_base_ptr_ios_base_ptr *in_stack_000000e0;
  uint in_stack_000000ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined2 in_stack_ffffffffffffff4e;
  undefined2 uVar1;
  string local_b0 [32];
  string local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [63];
  bool local_1;
  
  if (in_RDI == (long *)0x0) {
    err = 10;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    __rhs = &local_60;
    to_string<unsigned_int>(in_stack_000000ec,in_stack_000000e0);
    std::operator+((char *)CONCAT26(in_stack_ffffffffffffff4e,
                                    CONCAT15(in_stack_ffffffffffffff4d,
                                             CONCAT14(in_stack_ffffffffffffff4c,
                                                      in_stack_ffffffffffffff48))),__rhs);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string((string *)&local_60);
    local_1 = false;
  }
  else if ((ulong)in_ESI + 1 < (ulong)*(uint *)(in_RDI + 1)) {
    if ((*(byte *)((long)in_RDI + 0xd) & 1) == 0) {
      uVar1 = *(undefined2 *)(*in_RDI + (ulong)in_ESI);
    }
    else {
      uVar1 = CONCAT11(*(undefined1 *)(*in_RDI + (ulong)in_ESI),
                       *(undefined1 *)(*in_RDI + 1 + (ulong)in_ESI));
    }
    *in_RDX = uVar1;
    local_1 = true;
  }
  else {
    err = 0xb;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(in_stack_000000ec,in_stack_000000e0);
    std::operator+((char *)CONCAT26(in_stack_ffffffffffffff4e,
                                    CONCAT15(in_stack_ffffffffffffff4d,
                                             CONCAT14(in_stack_ffffffffffffff4c,
                                                      in_stack_ffffffffffffff48))),
                   in_stack_ffffffffffffff40);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool readChar16(bounded_buffer *b, std::uint32_t offset, char16_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 1 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  char16_t tmp;
  if (b->swapBytes) {
    std::uint8_t tmpBuf[2];
    tmpBuf[0] = *(b->buf + offset + 1);
    tmpBuf[1] = *(b->buf + offset);
    memcpy(&tmp, tmpBuf, sizeof(std::uint16_t));
  } else {
    memcpy(&tmp, (b->buf + offset), sizeof(std::uint16_t));
  }
  out = tmp;

  return true;
}